

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O2

void Eigen::internal::triangular_solve_matrix<double,_long,_2,_2,_false,_1,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  long lVar1;
  ulong size_00;
  size_t size_01;
  double dVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double depth;
  double *pdVar6;
  double dVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  double *pdVar15;
  double dVar16;
  long rows;
  double depth_00;
  long i;
  long lVar17;
  double *pdVar18;
  double dVar19;
  double cols;
  double dVar20;
  long lVar21;
  long lVar22;
  long j2;
  long lVar23;
  undefined1 local_188 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockW_stack_memory_destructor;
  double *local_90;
  double *local_70;
  double *local_58;
  double *local_50;
  double *local_40;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> local_34;
  gemm_pack_rhs<double,_long,_4,_1,_false,_true> local_33;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_true> local_32;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_31 [5];
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> pack_rhs;
  gemm_pack_rhs<double,_long,_4,_1,_false,_true> pack_rhs_panel;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_true> pack_lhs_panel;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  
  pdVar8 = (double *)local_188;
  lVar3 = blocking->m_mc;
  dVar4 = (double)blocking->m_kc;
  lVar10 = otherSize;
  if (lVar3 < otherSize) {
    lVar10 = lVar3;
  }
  pdVar11 = (double *)(lVar10 * (long)dVar4);
  if ((ulong)pdVar11 >> 0x3d != 0) {
    throw_std_bad_alloc();
  }
  pdVar18 = (double *)((long)dVar4 * size);
  size_00 = (long)pdVar11 * 8;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (size_00 < 0x20001) {
      local_188 = (undefined1  [8])(local_188 + -(size_00 + 0xf & 0xfffffffffffffff0));
      blockA_stack_memory_destructor.m_size._0_1_ = false;
      pdVar8 = (double *)local_188;
      local_58 = (double *)local_188;
    }
    else {
      local_58 = (double *)aligned_malloc(size_00);
      local_188 = (undefined1  [8])(double *)0x0;
      if (blocking->m_blockA == (LhsScalar *)0x0) {
        local_188 = (undefined1  [8])local_58;
      }
      blockA_stack_memory_destructor.m_size._0_1_ = true;
    }
  }
  else {
    blockA_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_00;
    local_188 = (undefined1  [8])0x0;
    pdVar8 = (double *)local_188;
    local_58 = blocking->m_blockA;
  }
  blockA_stack_memory_destructor.m_ptr = pdVar11;
  if ((double *)0x1fffffffffffffff < pdVar18) {
    pdVar8[-1] = 5.32955035022349e-318;
    throw_std_bad_alloc();
  }
  size_01 = (long)pdVar18 * 8;
  if (blocking->m_blockB == (double *)0x0) {
    if (size_01 < 0x20001) {
      pdVar8 = (double *)((long)pdVar8 - (size_01 + 0xf & 0xfffffffffffffff0));
      blockA_stack_memory_destructor._16_8_ = pdVar8;
      local_50 = pdVar8;
    }
    else {
      pdVar8[-1] = 5.32990113683203e-318;
      local_50 = (double *)aligned_malloc(size_01);
      blockA_stack_memory_destructor._16_8_ = (double *)0x0;
      if (blocking->m_blockB == (RhsScalar *)0x0) {
        blockA_stack_memory_destructor._16_8_ = local_50;
      }
    }
  }
  else {
    blockA_stack_memory_destructor._16_8_ = (double *)0x0;
    local_50 = blocking->m_blockB;
  }
  blockB_stack_memory_destructor.m_ptr = pdVar18;
  blockB_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_01;
  if (0x1fffffffffffffff < (ulong)((long)dVar4 * 8)) {
    pdVar8[-1] = 5.33023710147121e-318;
    throw_std_bad_alloc();
  }
  if (blocking->m_blockW == (double *)0x0) {
    if ((ulong)((long)dVar4 * 0x40) < 0x20001) {
      pdVar8 = pdVar8 + (long)dVar4 * -8;
      blockB_stack_memory_destructor._16_8_ = pdVar8;
      local_70 = pdVar8;
    }
    else {
      pdVar8[-1] = 5.330558244141e-318;
      local_70 = (double *)aligned_malloc((long)dVar4 * 0x40);
      blockB_stack_memory_destructor._16_8_ = (double *)0x0;
      if (blocking->m_blockW == (RhsScalar *)0x0) {
        blockB_stack_memory_destructor._16_8_ = local_70;
      }
    }
  }
  else {
    blockB_stack_memory_destructor._16_8_ = (double *)0x0;
    local_70 = blocking->m_blockW;
  }
  lVar13 = 0;
  dVar14 = (double)size;
  pdVar11 = _tri;
  local_90 = _other;
  while( true ) {
    dVar5 = dVar14;
    if ((long)dVar4 < (long)dVar14) {
      dVar5 = dVar4;
    }
    dVar19 = (double)(size - lVar13);
    if (dVar19 == 0.0 || size < lVar13) break;
    depth_00 = dVar19;
    if ((long)dVar4 < (long)dVar19) {
      depth_00 = dVar4;
    }
    cols = (double)((long)dVar19 - (long)depth_00);
    if (cols != 0.0 && (long)depth_00 <= (long)dVar19) {
      pdVar8[-2] = 0.0;
      pdVar8[-1] = 0.0;
      pdVar8[-3] = 5.33201573779623e-318;
      gemm_pack_rhs<double,_long,_4,_1,_false,_false>::operator()
                (&local_34,local_50 + (long)depth_00 * (long)depth_00,
                 _tri + lVar13 * triStride + (long)depth_00 + lVar13,triStride,(long)depth_00,
                 (long)cols,(long)pdVar8[-2],(long)pdVar8[-1]);
    }
    dVar19 = dVar5;
    pdVar18 = pdVar11;
    pdVar6 = local_50;
    for (lVar23 = 0; lVar23 < (long)depth_00; lVar23 = lVar23 + 4) {
      if (lVar23 != 0) {
        pdVar8[-1] = 1.97626258336499e-323;
        dVar7 = pdVar8[-1];
        if ((long)dVar19 < 4) {
          dVar7 = dVar19;
        }
        pdVar8[-1] = 0.0;
        pdVar8[-2] = depth_00;
        pdVar8[-3] = 5.33263331985354e-318;
        gemm_pack_rhs<double,_long,_4,_1,_false,_true>::operator()
                  (&local_33,pdVar6,pdVar18,triStride,lVar23,(long)dVar7,(long)pdVar8[-2],
                   (long)pdVar8[-1]);
      }
      pdVar18 = pdVar18 + 4;
      pdVar6 = pdVar6 + (long)dVar5 * 4;
      dVar19 = (double)((long)dVar19 + -4);
    }
    lVar22 = 0;
    pdVar8[-1] = 1.97626258336499e-323;
    dVar19 = pdVar8[-1];
    pdVar18 = local_90;
    lVar23 = otherSize;
    while( true ) {
      lVar12 = otherSize;
      if (lVar3 < otherSize) {
        lVar12 = lVar3;
      }
      if (lVar23 <= lVar12) {
        lVar12 = lVar23;
      }
      if (lVar12 < 1) {
        lVar12 = 0;
      }
      rows = otherSize - lVar22;
      if (rows == 0 || otherSize < lVar22) break;
      if (lVar10 <= rows) {
        rows = lVar10;
      }
      lVar21 = 0;
      dVar7 = dVar5;
      local_40 = pdVar18;
      while( true ) {
        dVar20 = dVar19;
        if ((long)dVar7 < 4) {
          dVar20 = dVar7;
        }
        if ((long)dVar20 < 1) {
          dVar20 = 0.0;
        }
        depth = (double)((long)depth_00 - lVar21);
        if (depth == 0.0 || (long)depth_00 < lVar21) break;
        if (3 < (long)depth) {
          depth = dVar19;
        }
        lVar1 = lVar21 + lVar13;
        if (lVar21 != 0) {
          pdVar8[-2] = (double)local_70;
          pdVar8[-4] = 0.0;
          pdVar8[-3] = 0.0;
          pdVar8[-5] = depth_00;
          pdVar8[-6] = depth_00;
          pdVar8[-7] = depth;
          pdVar8[-8] = (double)lVar21;
          pdVar8[-9] = 5.33457005718523e-318;
          gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                    (local_31,_other + lVar22 + lVar1 * otherStride,otherStride,local_58,
                     local_50 + lVar21 * (long)depth_00,rows,(long)pdVar8[-8],(long)pdVar8[-7],-1.0,
                     (long)pdVar8[-6],(long)pdVar8[-5],(long)pdVar8[-4],(long)pdVar8[-3],
                     (double *)pdVar8[-2]);
        }
        pdVar6 = local_40;
        for (dVar19 = 0.0; dVar19 != dVar20; dVar19 = (double)((long)dVar19 + 1)) {
          lVar9 = (long)dVar19 + lVar1;
          pdVar15 = local_40;
          for (dVar16 = 0.0; dVar16 != dVar19; dVar16 = (double)((long)dVar16 + 1)) {
            dVar2 = _tri[lVar9 + ((long)dVar16 + lVar1) * triStride];
            for (lVar17 = 0; lVar12 != lVar17; lVar17 = lVar17 + 1) {
              pdVar6[lVar17] = pdVar6[lVar17] - pdVar15[lVar17] * dVar2;
            }
            pdVar15 = pdVar15 + otherStride;
          }
          dVar16 = _tri[lVar9 * triStride + lVar9];
          for (lVar9 = 0; lVar12 != lVar9; lVar9 = lVar9 + 1) {
            pdVar6[lVar9] = pdVar6[lVar9] / dVar16;
          }
          pdVar6 = pdVar6 + otherStride;
        }
        pdVar8[-1] = (double)lVar21;
        pdVar8[-2] = depth_00;
        pdVar8[-3] = 5.33565206094963e-318;
        gemm_pack_lhs<double,_long,_4,_2,_0,_false,_true>::operator()
                  (&local_32,local_58,_other + lVar22 + lVar1 * otherStride,otherStride,(long)depth,
                   rows,(long)pdVar8[-2],(long)pdVar8[-1]);
        lVar21 = lVar21 + 4;
        dVar7 = (double)((long)dVar7 + -4);
        local_40 = local_40 + otherStride * 4;
        pdVar8[-1] = 1.97626258336499e-323;
        dVar19 = pdVar8[-1];
      }
      if (0 < (long)cols) {
        pdVar8[-2] = (double)local_70;
        pdVar8[-4] = 0.0;
        pdVar8[-3] = 0.0;
        pdVar8[-5] = -NAN;
        pdVar8[-7] = cols;
        pdVar8[-6] = -NAN;
        pdVar8[-8] = depth_00;
        pdVar8[-9] = 5.33645738795235e-318;
        gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                  (local_31,_other + ((long)depth_00 + lVar13) * otherStride + lVar22,otherStride,
                   local_58,local_50 + (long)depth_00 * (long)depth_00,rows,(long)pdVar8[-8],
                   (long)pdVar8[-7],-1.0,(long)pdVar8[-6],(long)pdVar8[-5],(long)pdVar8[-4],
                   (long)pdVar8[-3],(double *)pdVar8[-2]);
      }
      lVar22 = lVar22 + lVar10;
      lVar23 = lVar23 - lVar10;
      pdVar18 = pdVar18 + lVar10;
    }
    lVar13 = lVar13 + (long)dVar4;
    dVar14 = (double)((long)dVar14 - (long)dVar4);
    pdVar11 = (double *)((long)pdVar11 + (triStride * 8 + 8) * (long)dVar4);
    local_90 = local_90 + (long)dVar4 * otherStride;
  }
  pdVar8[-1] = 5.33706508869673e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockB_stack_memory_destructor.m_deallocate);
  pdVar8[-1] = 5.33712437657423e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockA_stack_memory_destructor.m_deallocate);
  pdVar8[-1] = 5.33718366445173e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_188);
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheRight,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index rows = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> rhs(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> lhs(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      RhsStorageOrder   = TriStorageOrder,
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*size;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar,Scalar, Index, Traits::mr, Traits::nr, false, Conjugate> gebp_kernel;
    gemm_pack_rhs<Scalar, Index, Traits::nr,RhsStorageOrder> pack_rhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr,RhsStorageOrder,false,true> pack_rhs_panel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, ColMajor, false, true> pack_lhs_panel;

    for(Index k2=IsLower ? size : 0;
        IsLower ? k2>0 : k2<size;
        IsLower ? k2-=kc : k2+=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? k2 : size-k2, kc);
      Index actual_k2 = IsLower ? k2-actual_kc : k2 ;

      Index startPanel = IsLower ? 0 : k2+actual_kc;
      Index rs = IsLower ? actual_k2 : size - actual_k2 - actual_kc;
      Scalar* geb = blockB+actual_kc*actual_kc;

      if (rs>0) pack_rhs(geb, &rhs(actual_k2,startPanel), triStride, actual_kc, rs);

      // triangular packing (we only pack the panels off the diagonal,
      // neglecting the blocks overlapping the diagonal
      {
        for (Index j2=0; j2<actual_kc; j2+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-j2, SmallPanelWidth);
          Index actual_j2 = actual_k2 + j2;
          Index panelOffset = IsLower ? j2+actualPanelWidth : 0;
          Index panelLength = IsLower ? actual_kc-j2-actualPanelWidth : j2;

          if (panelLength>0)
          pack_rhs_panel(blockB+j2*actual_kc,
                         &rhs(actual_k2+panelOffset, actual_j2), triStride,
                         panelLength, actualPanelWidth,
                         actual_kc, panelOffset);
        }
      }

      for(Index i2=0; i2<rows; i2+=mc)
      {
        const Index actual_mc = (std::min)(mc,rows-i2);

        // triangular solver kernel
        {
          // for each small block of the diagonal (=> vertical panels of rhs)
          for (Index j2 = IsLower
                      ? (actual_kc - ((actual_kc%SmallPanelWidth) ? Index(actual_kc%SmallPanelWidth)
                                                                  : Index(SmallPanelWidth)))
                      : 0;
               IsLower ? j2>=0 : j2<actual_kc;
               IsLower ? j2-=SmallPanelWidth : j2+=SmallPanelWidth)
          {
            Index actualPanelWidth = std::min<Index>(actual_kc-j2, SmallPanelWidth);
            Index absolute_j2 = actual_k2 + j2;
            Index panelOffset = IsLower ? j2+actualPanelWidth : 0;
            Index panelLength = IsLower ? actual_kc - j2 - actualPanelWidth : j2;

            // GEBP
            if(panelLength>0)
            {
              gebp_kernel(&lhs(i2,absolute_j2), otherStride,
                          blockA, blockB+j2*actual_kc,
                          actual_mc, panelLength, actualPanelWidth,
                          Scalar(-1),
                          actual_kc, actual_kc, // strides
                          panelOffset, panelOffset, // offsets
                          blockW);  // workspace
            }

            // unblocked triangular solve
            for (Index k=0; k<actualPanelWidth; ++k)
            {
              Index j = IsLower ? absolute_j2+actualPanelWidth-k-1 : absolute_j2+k;

              Scalar* r = &lhs(i2,j);
              for (Index k3=0; k3<k; ++k3)
              {
                Scalar b = conj(rhs(IsLower ? j+1+k3 : absolute_j2+k3,j));
                Scalar* a = &lhs(i2,IsLower ? j+1+k3 : absolute_j2+k3);
                for (Index i=0; i<actual_mc; ++i)
                  r[i] -= a[i] * b;
              }
              if((Mode & UnitDiag)==0)
              {
                Scalar b = conj(rhs(j,j));
                for (Index i=0; i<actual_mc; ++i)
                  r[i] /= b;
              }
            }

            // pack the just computed part of lhs to A
            pack_lhs_panel(blockA, _other+absolute_j2*otherStride+i2, otherStride,
                           actualPanelWidth, actual_mc,
                           actual_kc, j2);
          }
        }

        if (rs>0)
          gebp_kernel(_other+i2+startPanel*otherStride, otherStride, blockA, geb,
                      actual_mc, actual_kc, rs, Scalar(-1),
                      -1, -1, 0, 0, blockW);
      }
    }
  }